

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall
peach::exception::UndefinedOperatorError::UndefinedOperatorError
          (UndefinedOperatorError *this,size_t line,size_t position)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"UndefinedOperatorError",&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"can\'t find operator",&local_5a);
  PositionalError::PositionalError(&this->super_PositionalError,line,position,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&(this->super_PositionalError).super_PeachException =
       &PTR__PeachException_00141aa0;
  return;
}

Assistant:

UndefinedOperatorError(std::size_t line,
                           std::size_t position)
        : PositionalError(line,
                          position,
                          "UndefinedOperatorError", "can't find operator")
    {
    }